

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O3

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QWidget *pQVar1;
  QMenuBar *this_00;
  QStatusBar *this_01;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QArrayData *local_38;
  undefined8 uStack_30;
  long local_28;
  
  QObject::objectName();
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  if (local_28 == 0) {
    QVar5.m_data = (storage_type *)0xa;
    QVar5.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar5);
    QObject::setObjectName((QString *)MainWindow);
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,2,8);
      }
    }
  }
  local_38 = (QArrayData *)&DAT_25800000320;
  QWidget::resize((QSize *)MainWindow);
  pQVar1 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar1,MainWindow,0);
  this->centralwidget = pQVar1;
  QVar2.m_data = (storage_type *)0xd;
  QVar2.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar2);
  QObject::setObjectName((QString *)pQVar1);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  QMainWindow::setCentralWidget((QWidget *)MainWindow);
  this_00 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(this_00,(QWidget *)MainWindow);
  this->menubar = this_00;
  QVar3.m_data = (storage_type *)0x7;
  QVar3.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar3);
  QObject::setObjectName((QString *)this_00);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0xe0000031f;
  QWidget::setGeometry((QRect *)this->menubar);
  QMainWindow::setMenuBar((QMenuBar *)MainWindow);
  this_01 = (QStatusBar *)operator_new(0x28);
  QStatusBar::QStatusBar(this_01,(QWidget *)MainWindow);
  this->statusbar = this_01;
  QVar4.m_data = (storage_type *)0x9;
  QVar4.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar4);
  QObject::setObjectName((QString *)this_01);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  QMainWindow::setStatusBar((QStatusBar *)MainWindow);
  retranslateUi(this,MainWindow);
  QMetaObject::connectSlotsByName((QObject *)MainWindow);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(800, 600);
        centralwidget = new QWidget(MainWindow);
        centralwidget->setObjectName(QString::fromUtf8("centralwidget"));
        MainWindow->setCentralWidget(centralwidget);
        menubar = new QMenuBar(MainWindow);
        menubar->setObjectName(QString::fromUtf8("menubar"));
        menubar->setGeometry(QRect(0, 0, 800, 15));
        MainWindow->setMenuBar(menubar);
        statusbar = new QStatusBar(MainWindow);
        statusbar->setObjectName(QString::fromUtf8("statusbar"));
        MainWindow->setStatusBar(statusbar);

        retranslateUi(MainWindow);

        QMetaObject::connectSlotsByName(MainWindow);
    }